

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O0

string * __thiscall
pbrt::PiecewiseLinearSpectrum::ParameterString_abi_cxx11_(PiecewiseLinearSpectrum *this)

{
  float *pfVar1;
  ulong uVar2;
  float *args_1;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RSI;
  string *in_RDI;
  size_t i;
  string name;
  string *ret;
  PiecewiseLinearSpectrum *in_stack_ffffffffffffff48;
  SpectrumHandle *in_stack_ffffffffffffff50;
  string *fmt;
  string local_78 [32];
  float *local_58;
  undefined1 local_49;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  string local_30 [48];
  
  fmt = in_RDI;
  SpectrumHandle::TaggedPointer<pbrt::PiecewiseLinearSpectrum_const>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  FindMatchingNamedSpectrum_abi_cxx11_
            ((SpectrumHandle *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    StringPrintf<std::__cxx11::string&>((char *)fmt,in_RDI);
  }
  else {
    local_49 = 0;
    std::__cxx11::string::string((string *)in_RDI);
    for (local_58 = (float *)0x0; pfVar1 = local_58,
        args_1 = (float *)pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size
                                    (in_RSI), pfVar1 < args_1;
        local_58 = (float *)((long)local_58 + 1)) {
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                (in_RSI,(size_type)local_58);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                (in_RSI + 1,(size_type)local_58);
      StringPrintf<float_const&,float_const&>((char *)fmt,(float *)in_RDI,args_1);
      std::__cxx11::string::operator+=((string *)in_RDI,local_78);
      std::__cxx11::string::~string(local_78);
    }
    local_49 = 1;
  }
  std::__cxx11::string::~string(local_30);
  return fmt;
}

Assistant:

std::string PiecewiseLinearSpectrum::ParameterString() const {
    std::string name = FindMatchingNamedSpectrum(this);
    if (!name.empty())
        return StringPrintf("\"%s\"", name);

    std::string ret;
    for (size_t i = 0; i < lambdas.size(); ++i)
        ret += StringPrintf("%f %f ", lambdas[i], values[i]);
    return ret;
}